

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

void __thiscall
cmELFInternalImpl<cmELFTypes32>::ByteSwap
          (cmELFInternalImpl<cmELFTypes32> *this,ELF_Shdr *sec_header)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined4 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  auVar48._0_4_ = sec_header->sh_name;
  auVar48._4_4_ = sec_header->sh_type;
  auVar48._8_4_ = sec_header->sh_flags;
  auVar48._12_4_ = sec_header->sh_addr;
  auVar51._0_4_ = sec_header->sh_offset;
  auVar51._4_4_ = sec_header->sh_size;
  auVar51._8_4_ = sec_header->sh_link;
  auVar51._12_4_ = sec_header->sh_info;
  auVar52[1] = 0;
  auVar52[0] = (byte)auVar48._8_4_;
  auVar52[2] = (char)((uint)auVar48._8_4_ >> 8);
  auVar52[3] = 0;
  auVar52[4] = (char)((uint)auVar48._8_4_ >> 0x10);
  auVar52[5] = 0;
  auVar52[6] = (char)((uint)auVar48._8_4_ >> 0x18);
  auVar52[7] = 0;
  auVar52[8] = (char)auVar48._12_4_;
  auVar52[9] = 0;
  auVar52[10] = (char)((uint)auVar48._12_4_ >> 8);
  auVar52[0xb] = 0;
  auVar52[0xc] = (char)((uint)auVar48._12_4_ >> 0x10);
  auVar52[0xd] = 0;
  auVar52[0xe] = (char)((uint)auVar48._12_4_ >> 0x18);
  auVar52[0xf] = 0;
  auVar53 = pshuflw(auVar52,auVar52,0x1b);
  auVar54 = pshufhw(auVar53,auVar53,0x1b);
  auVar20[0xd] = 0;
  auVar20._0_13_ = auVar48._0_13_;
  auVar20[0xe] = (char)((uint)auVar48._4_4_ >> 0x18);
  auVar23[0xc] = (char)((uint)auVar48._4_4_ >> 0x10);
  auVar23._0_12_ = auVar48._0_12_;
  auVar23._13_2_ = auVar20._13_2_;
  auVar26[0xb] = 0;
  auVar26._0_11_ = auVar48._0_11_;
  auVar26._12_3_ = auVar23._12_3_;
  auVar29[10] = (char)((uint)auVar48._4_4_ >> 8);
  auVar29._0_10_ = auVar48._0_10_;
  auVar29._11_4_ = auVar26._11_4_;
  auVar32[9] = 0;
  auVar32._0_9_ = auVar48._0_9_;
  auVar32._10_5_ = auVar29._10_5_;
  auVar35[8] = (char)auVar48._4_4_;
  auVar35._0_8_ = auVar48._0_8_;
  auVar35._9_6_ = auVar32._9_6_;
  auVar38._7_8_ = 0;
  auVar38._0_7_ = auVar35._8_7_;
  auVar41._1_8_ = SUB158(auVar38 << 0x40,7);
  auVar41[0] = (char)((uint)auVar48._0_4_ >> 0x18);
  auVar41._9_6_ = 0;
  auVar42._1_10_ = SUB1510(auVar41 << 0x30,5);
  auVar42[0] = (char)((uint)auVar48._0_4_ >> 0x10);
  auVar42._11_4_ = 0;
  auVar53._3_12_ = SUB1512(auVar42 << 0x20,3);
  auVar53[2] = (char)((uint)auVar48._0_4_ >> 8);
  auVar53[0] = (byte)auVar48._0_4_;
  auVar53[1] = 0;
  auVar53[0xf] = 0;
  auVar48 = pshuflw(auVar53,auVar53,0x1b);
  auVar48 = pshufhw(auVar48,auVar48,0x1b);
  sVar2 = auVar48._0_2_;
  sVar3 = auVar48._2_2_;
  sVar4 = auVar48._4_2_;
  sVar5 = auVar48._6_2_;
  sVar6 = auVar48._8_2_;
  sVar7 = auVar48._10_2_;
  sVar8 = auVar48._12_2_;
  sVar9 = auVar48._14_2_;
  sVar10 = auVar54._0_2_;
  sVar11 = auVar54._2_2_;
  sVar12 = auVar54._4_2_;
  sVar13 = auVar54._6_2_;
  sVar14 = auVar54._8_2_;
  sVar15 = auVar54._10_2_;
  sVar16 = auVar54._12_2_;
  sVar17 = auVar54._14_2_;
  *(char *)&sec_header->sh_name = (0 < sVar2) * (sVar2 < 0x100) * auVar48[0] - (0xff < sVar2);
  *(char *)((long)&sec_header->sh_name + 1) =
       (0 < sVar3) * (sVar3 < 0x100) * auVar48[2] - (0xff < sVar3);
  *(char *)((long)&sec_header->sh_name + 2) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar48[4] - (0xff < sVar4);
  *(char *)((long)&sec_header->sh_name + 3) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar48[6] - (0xff < sVar5);
  *(char *)&sec_header->sh_type = (0 < sVar6) * (sVar6 < 0x100) * auVar48[8] - (0xff < sVar6);
  *(char *)((long)&sec_header->sh_type + 1) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar48[10] - (0xff < sVar7);
  *(char *)((long)&sec_header->sh_type + 2) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar48[0xc] - (0xff < sVar8);
  *(char *)((long)&sec_header->sh_type + 3) =
       (0 < sVar9) * (sVar9 < 0x100) * auVar48[0xe] - (0xff < sVar9);
  *(char *)&sec_header->sh_flags = (0 < sVar10) * (sVar10 < 0x100) * auVar54[0] - (0xff < sVar10);
  *(char *)((long)&sec_header->sh_flags + 1) =
       (0 < sVar11) * (sVar11 < 0x100) * auVar54[2] - (0xff < sVar11);
  *(char *)((long)&sec_header->sh_flags + 2) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar54[4] - (0xff < sVar12);
  *(char *)((long)&sec_header->sh_flags + 3) =
       (0 < sVar13) * (sVar13 < 0x100) * auVar54[6] - (0xff < sVar13);
  *(char *)&sec_header->sh_addr = (0 < sVar14) * (sVar14 < 0x100) * auVar54[8] - (0xff < sVar14);
  *(char *)((long)&sec_header->sh_addr + 1) =
       (0 < sVar15) * (sVar15 < 0x100) * auVar54[10] - (0xff < sVar15);
  *(char *)((long)&sec_header->sh_addr + 2) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar54[0xc] - (0xff < sVar16);
  *(char *)((long)&sec_header->sh_addr + 3) =
       (0 < sVar17) * (sVar17 < 0x100) * auVar54[0xe] - (0xff < sVar17);
  auVar54[1] = 0;
  auVar54[0] = (byte)auVar51._8_4_;
  auVar54[2] = (char)((uint)auVar51._8_4_ >> 8);
  auVar54[3] = 0;
  auVar54[4] = (char)((uint)auVar51._8_4_ >> 0x10);
  auVar54[5] = 0;
  auVar54[6] = (char)((uint)auVar51._8_4_ >> 0x18);
  auVar54[7] = 0;
  auVar54[8] = (char)auVar51._12_4_;
  auVar54[9] = 0;
  auVar54[10] = (char)((uint)auVar51._12_4_ >> 8);
  auVar54[0xb] = 0;
  auVar54[0xc] = (char)((uint)auVar51._12_4_ >> 0x10);
  auVar54[0xd] = 0;
  auVar54[0xe] = (char)((uint)auVar51._12_4_ >> 0x18);
  auVar54[0xf] = 0;
  auVar48 = pshuflw(auVar54,auVar54,0x1b);
  auVar48 = pshufhw(auVar48,auVar48,0x1b);
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar51._0_13_;
  auVar18[0xe] = (char)((uint)auVar51._4_4_ >> 0x18);
  auVar21[0xc] = (char)((uint)auVar51._4_4_ >> 0x10);
  auVar21._0_12_ = auVar51._0_12_;
  auVar21._13_2_ = auVar18._13_2_;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar51._0_11_;
  auVar24._12_3_ = auVar21._12_3_;
  auVar27[10] = (char)((uint)auVar51._4_4_ >> 8);
  auVar27._0_10_ = auVar51._0_10_;
  auVar27._11_4_ = auVar24._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar51._0_9_;
  auVar30._10_5_ = auVar27._10_5_;
  auVar33[8] = (char)auVar51._4_4_;
  auVar33._0_8_ = auVar51._0_8_;
  auVar33._9_6_ = auVar30._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar33._8_7_;
  auVar43._1_8_ = SUB158(auVar39 << 0x40,7);
  auVar43[0] = (char)((uint)auVar51._0_4_ >> 0x18);
  auVar43._9_6_ = 0;
  auVar44._1_10_ = SUB1510(auVar43 << 0x30,5);
  auVar44[0] = (char)((uint)auVar51._0_4_ >> 0x10);
  auVar44._11_4_ = 0;
  auVar36[2] = (char)((uint)auVar51._0_4_ >> 8);
  auVar36._0_2_ = (ushort)auVar51._0_4_;
  auVar36._3_12_ = SUB1512(auVar44 << 0x20,3);
  auVar50._0_2_ = (ushort)auVar51._0_4_ & 0xff;
  auVar50._2_13_ = auVar36._2_13_;
  auVar50[0xf] = 0;
  auVar51 = pshuflw(auVar50,auVar50,0x1b);
  auVar51 = pshufhw(auVar51,auVar51,0x1b);
  sVar2 = auVar51._0_2_;
  sVar3 = auVar51._2_2_;
  sVar4 = auVar51._4_2_;
  sVar5 = auVar51._6_2_;
  sVar6 = auVar51._8_2_;
  sVar7 = auVar51._10_2_;
  sVar8 = auVar51._12_2_;
  sVar9 = auVar51._14_2_;
  sVar10 = auVar48._0_2_;
  sVar11 = auVar48._2_2_;
  sVar12 = auVar48._4_2_;
  sVar13 = auVar48._6_2_;
  sVar14 = auVar48._8_2_;
  sVar15 = auVar48._10_2_;
  sVar16 = auVar48._12_2_;
  sVar17 = auVar48._14_2_;
  *(char *)&sec_header->sh_offset = (0 < sVar2) * (sVar2 < 0x100) * auVar51[0] - (0xff < sVar2);
  *(char *)((long)&sec_header->sh_offset + 1) =
       (0 < sVar3) * (sVar3 < 0x100) * auVar51[2] - (0xff < sVar3);
  *(char *)((long)&sec_header->sh_offset + 2) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar51[4] - (0xff < sVar4);
  *(char *)((long)&sec_header->sh_offset + 3) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar51[6] - (0xff < sVar5);
  *(char *)&sec_header->sh_size = (0 < sVar6) * (sVar6 < 0x100) * auVar51[8] - (0xff < sVar6);
  *(char *)((long)&sec_header->sh_size + 1) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar51[10] - (0xff < sVar7);
  *(char *)((long)&sec_header->sh_size + 2) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar51[0xc] - (0xff < sVar8);
  *(char *)((long)&sec_header->sh_size + 3) =
       (0 < sVar9) * (sVar9 < 0x100) * auVar51[0xe] - (0xff < sVar9);
  *(char *)&sec_header->sh_link = (0 < sVar10) * (sVar10 < 0x100) * auVar48[0] - (0xff < sVar10);
  *(char *)((long)&sec_header->sh_link + 1) =
       (0 < sVar11) * (sVar11 < 0x100) * auVar48[2] - (0xff < sVar11);
  *(char *)((long)&sec_header->sh_link + 2) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar48[4] - (0xff < sVar12);
  *(char *)((long)&sec_header->sh_link + 3) =
       (0 < sVar13) * (sVar13 < 0x100) * auVar48[6] - (0xff < sVar13);
  *(char *)&sec_header->sh_info = (0 < sVar14) * (sVar14 < 0x100) * auVar48[8] - (0xff < sVar14);
  *(char *)((long)&sec_header->sh_info + 1) =
       (0 < sVar15) * (sVar15 < 0x100) * auVar48[10] - (0xff < sVar15);
  *(char *)((long)&sec_header->sh_info + 2) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar48[0xc] - (0xff < sVar16);
  *(char *)((long)&sec_header->sh_info + 3) =
       (0 < sVar17) * (sVar17 < 0x100) * auVar48[0xe] - (0xff < sVar17);
  uVar1._0_4_ = sec_header->sh_addralign;
  uVar1._4_4_ = sec_header->sh_entsize;
  auVar19._8_6_ = 0;
  auVar19._0_8_ = uVar1;
  auVar19[0xe] = (char)((uint)uVar1._4_4_ >> 0x18);
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22[0xc] = (char)((uint)uVar1._4_4_ >> 0x10);
  auVar22._13_2_ = auVar19._13_2_;
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar1;
  auVar25._12_3_ = auVar22._12_3_;
  auVar28._8_2_ = 0;
  auVar28._0_8_ = uVar1;
  auVar28[10] = (char)((uint)uVar1._4_4_ >> 8);
  auVar28._11_4_ = auVar25._11_4_;
  auVar31._8_2_ = 0;
  auVar31._0_8_ = uVar1;
  auVar31._10_5_ = auVar28._10_5_;
  auVar34[8] = (char)uVar1._4_4_;
  auVar34._0_8_ = uVar1;
  auVar34._9_6_ = auVar31._9_6_;
  auVar40._7_8_ = 0;
  auVar40._0_7_ = auVar34._8_7_;
  auVar45._1_8_ = SUB158(auVar40 << 0x40,7);
  auVar45[0] = (char)((uint)(undefined4)uVar1 >> 0x18);
  auVar45._9_6_ = 0;
  auVar46._1_10_ = SUB1510(auVar45 << 0x30,5);
  auVar46[0] = (char)((uint)(undefined4)uVar1 >> 0x10);
  auVar46._11_4_ = 0;
  auVar37[2] = (char)((uint)(undefined4)uVar1 >> 8);
  auVar37._0_2_ = (ushort)(undefined4)uVar1;
  auVar37._3_12_ = SUB1512(auVar46 << 0x20,3);
  auVar49._0_2_ = (ushort)(undefined4)uVar1 & 0xff;
  auVar49._2_13_ = auVar37._2_13_;
  auVar49[0xf] = 0;
  auVar48 = pshuflw(auVar49,auVar49,0x1b);
  auVar48 = pshufhw(auVar48,auVar48,0x1b);
  sVar2 = auVar48._0_2_;
  sVar3 = auVar48._2_2_;
  sVar4 = auVar48._4_2_;
  sVar5 = auVar48._6_2_;
  uVar47 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar48[6] - (0xff < sVar5),
                    CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar48[4] - (0xff < sVar4),
                             CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar48[2] - (0xff < sVar3),
                                      (0 < sVar2) * (sVar2 < 0x100) * auVar48[0] - (0xff < sVar2))))
  ;
  sVar2 = auVar48._8_2_;
  sVar3 = auVar48._10_2_;
  sVar4 = auVar48._12_2_;
  sVar5 = auVar48._14_2_;
  sec_header->sh_addralign = uVar47;
  sec_header->sh_entsize =
       (int)(CONCAT17((0 < sVar5) * (sVar5 < 0x100) * auVar48[0xe] - (0xff < sVar5),
                      CONCAT16((0 < sVar4) * (sVar4 < 0x100) * auVar48[0xc] - (0xff < sVar4),
                               CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar48[10] - (0xff < sVar3)
                                        ,CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar48[8] -
                                                  (0xff < sVar2),uVar47)))) >> 0x20);
  return;
}

Assistant:

static void cmELFByteSwap(char* data, cmELFByteSwapSize<4> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[3];
  data[3] = one_byte;
  one_byte = data[1];
  data[1] = data[2];
  data[2] = one_byte;
}